

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

Sfm_Tim_t * Sfm_TimStart(Mio_Library_t *pLib,Scl_Con_t *pExt,Abc_Ntk_t *pNtk,int DeltaCrit)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Sfm_Tim_t *p;
  int *piVar6;
  uint uVar7;
  
  p = (Sfm_Tim_t *)calloc(1,0x70);
  p->pLib = pLib;
  p->pExt = pExt;
  p->pNtk = pNtk;
  pVVar2 = pNtk->vObjs;
  iVar5 = pVVar2->nSize;
  uVar4 = iVar5 * 3;
  if (iVar5 < 1) {
    iVar5 = 0;
    bVar3 = false;
    uVar7 = uVar4;
  }
  else {
    piVar6 = (int *)malloc((ulong)uVar4 * 4);
    (p->vTimArrs).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0053c6aa;
    (p->vTimArrs).nCap = uVar4;
    memset(piVar6,0,(ulong)uVar4 << 2);
    iVar1 = pVVar2->nSize;
    iVar5 = (p->vTimReqs).nCap;
    bVar3 = 0 < iVar1;
    uVar7 = iVar1 * 3;
  }
  (p->vTimArrs).nSize = uVar4;
  if (iVar5 < (int)uVar7) {
    piVar6 = (int *)malloc((long)(int)uVar7 << 2);
    (p->vTimReqs).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0053c6aa:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vTimReqs).nCap = uVar7;
  }
  else {
    piVar6 = (int *)0x0;
  }
  if (bVar3) {
    memset(piVar6,0,(ulong)uVar7 << 2);
  }
  (p->vTimReqs).nSize = uVar7;
  iVar5 = Sfm_TimTrace(p);
  p->Delay = iVar5;
  if (DeltaCrit - 1U < 999999) {
    p->DeltaCrit = DeltaCrit;
    return p;
  }
  __assert_fail("DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                ,0xee,"Sfm_Tim_t *Sfm_TimStart(Mio_Library_t *, Scl_Con_t *, Abc_Ntk_t *, int)");
}

Assistant:

Sfm_Tim_t * Sfm_TimStart( Mio_Library_t * pLib, Scl_Con_t * pExt, Abc_Ntk_t * pNtk, int DeltaCrit )
{
    Sfm_Tim_t * p = ABC_CALLOC( Sfm_Tim_t, 1 );
    p->pLib = pLib;
    p->pExt = pExt;
    p->pNtk = pNtk;
    Vec_IntFill( &p->vTimArrs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    Vec_IntFill( &p->vTimReqs,  3*Abc_NtkObjNumMax(pNtk), 0 );
    p->Delay = Sfm_TimTrace( p );
    assert( DeltaCrit > 0 && DeltaCrit < Scl_Flt2Int(1000.0) );
    p->DeltaCrit = DeltaCrit;
    return p;
}